

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O0

int Gia_ManCombMarkUsed(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_28;
  byte local_22;
  int local_20;
  int local_1c;
  int nNodes;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      _nNodes = Gia_ManObj(p,local_1c);
      bVar3 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(_nNodes);
    local_22 = 0;
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsBuf(_nNodes);
      local_22 = iVar1 != 0 ^ 0xff;
    }
    *(ulong *)_nNodes = *(ulong *)_nNodes & 0xffffffffbfffffff | (ulong)(local_22 & 1) << 0x1e;
    local_1c = local_1c + 1;
  }
  iVar1 = Gia_ManBufNum(p);
  if (iVar1 == 0) {
    local_28 = p->nObjs;
  }
  else {
    local_28 = 0;
  }
  local_1c = local_28;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      _nNodes = Gia_ManObj(p,local_1c);
      bVar3 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsBuf(_nNodes);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin0(_nNodes);
      iVar1 = Gia_ManCombMarkUsed_rec(p,pGVar2);
      local_20 = iVar1 + local_20;
    }
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar3 = false;
    if (local_1c < iVar1) {
      _nNodes = Gia_ManCo(p,local_1c);
      bVar3 = _nNodes != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjFanin0(_nNodes);
    iVar1 = Gia_ManCombMarkUsed_rec(p,pGVar2);
    local_20 = iVar1 + local_20;
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gia_ManCombMarkUsed( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj);
    Gia_ManForEachBuf( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    return nNodes;
}